

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.c++
# Opt level: O3

StringPtr capnp::operator*(uint param_1)

{
  StringPtr SVar1;
  
  if (param_1 < 3) {
    SVar1.content.ptr = &DAT_002ed690 + *(int *)(&DAT_002ed690 + (ulong)param_1 * 4);
    SVar1.content.size_ = *(size_t *)(&DAT_002ed678 + (ulong)param_1 * 8);
    return (StringPtr)SVar1.content;
  }
  kj::_::unreachable();
}

Assistant:

kj::StringPtr KJ_STRINGIFY(Equality res) {
  switch(res) {
    case Equality::NOT_EQUAL:
      return "NOT_EQUAL";
    case Equality::EQUAL:
      return "EQUAL";
    case Equality::UNKNOWN_CONTAINS_CAPS:
      return "UNKNOWN_CONTAINS_CAPS";
  }
  KJ_UNREACHABLE;
}